

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stat_mgr.hxx
# Opt level: O0

void __thiscall nuraft::stat_elem::set(stat_elem *this,int64_t value)

{
  int64_t value_local;
  stat_elem *this_local;
  
  return;
}

Assistant:

inline void set(int64_t value) {
#ifndef ENABLE_RAFT_STATS
        return;
#endif
        assert(stat_type_ != HISTOGRAM);
        if (stat_type_ == COUNTER) {
            counter_.store(value, std::memory_order_relaxed);
        } else {
            gauge_.store(value, std::memory_order_relaxed);
        }
    }